

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

IStreamingReporterPtr __thiscall
Catch::ReporterFactory<Catch::CompactReporter>::create
          (ReporterFactory<Catch::CompactReporter> *this,ReporterConfig *config)

{
  _func_int **in_RAX;
  ReporterConfig *in_RDX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  Detail::make_unique<Catch::CompactReporter,Catch::ReporterConfig_const&>
            ((Detail *)&local_18,in_RDX);
  (this->super_IReporterFactory)._vptr_IReporterFactory = local_18;
  return (IStreamingReporterPtr)(IStreamingReporter *)this;
}

Assistant:

IStreamingReporterPtr create( ReporterConfig const& config ) const override {
            return Detail::make_unique<T>( config );
        }